

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall RealCommandRunner::WaitForCommand(RealCommandRunner *this,Result *result)

{
  bool bVar1;
  ExitStatus EVar2;
  Subprocess *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  
  while (this_00 = SubprocessSet::NextFinished(&this->subprocs_), this_00 == (Subprocess *)0x0) {
    bVar1 = SubprocessSet::DoWork(&this->subprocs_);
    if (bVar1) goto LAB_00108d34;
  }
  EVar2 = Subprocess::Finish(this_00);
  result->status = EVar2;
  Subprocess::GetOutput_abi_cxx11_(this_00);
  std::__cxx11::string::_M_assign((string *)&result->output);
  p_Var3 = (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &(this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = __position._M_node;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (*(Subprocess **)(p_Var3 + 1) >= this_00) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(Subprocess **)(p_Var3 + 1) < this_00];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((p_Var4 != __position._M_node) && (*(Subprocess **)(p_Var4 + 1) <= this_00)) {
      __position._M_node = p_Var4;
    }
  }
  result->edge = (Edge *)__position._M_node[1]._M_parent;
  std::
  _Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
  ::erase_abi_cxx11_((_Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                      *)&this->subproc_to_edge_,__position);
  Subprocess::~Subprocess(this_00);
  operator_delete(this_00,0x30);
LAB_00108d34:
  return this_00 != (Subprocess *)0x0;
}

Assistant:

bool RealCommandRunner::WaitForCommand(Result* result) {
  Subprocess* subproc;
  while ((subproc = subprocs_.NextFinished()) == NULL) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return false;
  }

  result->status = subproc->Finish();
  result->output = subproc->GetOutput();

  map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.find(subproc);
  result->edge = e->second;
  subproc_to_edge_.erase(e);

  delete subproc;
  return true;
}